

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInstancedRenderingTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::InstancedRenderingCase::iterate(InstancedRenderingCase *this)

{
  RenderContext *context;
  bool bVar1;
  deUint32 seed;
  int iVar2;
  int iVar3;
  RenderTarget *pRVar4;
  char *description;
  int width;
  int height;
  Surface resultImg;
  Surface referenceImg;
  Random rnd;
  PixelBufferAccess local_58;
  
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  width = pRVar4->m_width;
  if (0x7f < width) {
    width = 0x80;
  }
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  height = 0x80;
  if (pRVar4->m_height < 0x80) {
    height = pRVar4->m_height;
  }
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = pRVar4->m_width;
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = pRVar4->m_height;
  seed = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,seed);
  iVar2 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar2 - width);
  iVar3 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar3 - height);
  tcu::Surface::Surface(&referenceImg,width,height);
  tcu::Surface::Surface(&resultImg,width,height);
  glwViewport(iVar2,iVar3,width,height);
  setupAndRender(this);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess(&local_58,&resultImg);
  glu::readPixels(context,iVar2,iVar3,&local_58);
  computeReference(this,&referenceImg);
  bVar1 = tcu::fuzzyCompare(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                            "ComparisonResult","Image comparison result",&referenceImg,&resultImg,
                            0.05,COMPARE_LOG_RESULT);
  description = "Fail";
  if (bVar1) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar1,description
            );
  tcu::Surface::~Surface(&resultImg);
  tcu::Surface::~Surface(&referenceImg);
  return STOP;
}

Assistant:

InstancedRenderingCase::IterateResult InstancedRenderingCase::iterate (void)
{
	int							width			= deMin32(m_context.getRenderTarget().getWidth(), MAX_RENDER_WIDTH);
	int							height			= deMin32(m_context.getRenderTarget().getHeight(), MAX_RENDER_HEIGHT);

	int							xOffsetMax		= m_context.getRenderTarget().getWidth() - width;
	int							yOffsetMax		= m_context.getRenderTarget().getHeight() - height;

	de::Random					rnd				(deStringHash(getName()));

	int							xOffset			= rnd.getInt(0, xOffsetMax);
	int							yOffset			= rnd.getInt(0, yOffsetMax);
	tcu::Surface				referenceImg	(width, height);
	tcu::Surface				resultImg		(width, height);

	// Draw result.

	glViewport(xOffset, yOffset, width, height);

	setupAndRender();

	glu::readPixels(m_context.getRenderContext(), xOffset, yOffset, resultImg.getAccess());

	// Compute reference.

	computeReference(referenceImg);

	// Compare.

	bool testOk = tcu::fuzzyCompare(m_testCtx.getLog(), "ComparisonResult", "Image comparison result", referenceImg, resultImg, 0.05f, tcu::COMPARE_LOG_RESULT);

	m_testCtx.setTestResult(testOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							testOk ? "Pass"					: "Fail");

	return STOP;
}